

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall anon_unknown.dwarf_2e6623f::RawTRDescriptor::Clone(RawTRDescriptor *this)

{
  __uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  _Var1;
  undefined8 uVar2;
  pointer *__ptr;
  long in_RSI;
  long in_FS_OFFSET;
  long *local_28;
  __uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(undefined8 **)(in_RSI + 0x10) == *(undefined8 **)(in_RSI + 8)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      uVar2 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
      if (local_28 != (long *)0x0) {
        (**(code **)(*local_28 + 8))();
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        _Unwind_Resume(uVar2);
      }
    }
  }
  else {
    (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x58))(&local_28);
    std::
    make_unique<(anonymous_namespace)::RawTRDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
              ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                *)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
    .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
         .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
    .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl =
         (tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
          )(_Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
            )0x0;
    (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
         .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
    std::
    unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
                   *)&local_20);
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 8))();
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
              )(__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
                )this;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> Clone() const override
    {
        return std::make_unique<RawTRDescriptor>(m_pubkey_args.at(0)->Clone());
    }